

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Options *pOVar5;
  ImmutableFieldGenerator *pIVar6;
  MessageOptions *this_00;
  OneofGeneratorInfo *pOVar7;
  AlphaNum *a;
  AlphaNum *a_00;
  iterator iVar8;
  string_view local_3f0;
  string_view local_3e0;
  string_view local_3d0;
  string_view local_3c0;
  string_view local_3b0;
  string_view local_3a0;
  string_view local_390;
  AlphaNum local_380;
  string local_350;
  string_view local_330;
  FieldDescriptor *local_320;
  FieldDescriptor *field_3;
  undefined1 auStack_310 [4];
  int j_1;
  OneofDescriptor *local_300;
  OneofDescriptor *oneof_1;
  pair<const_int,_const_google::protobuf::OneofDescriptor_*> *kv_1;
  int local_2e8;
  undefined1 local_2e0 [8];
  iterator __end3_1;
  undefined1 local_2c0 [8];
  iterator __begin3_1;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *__range3_1;
  string_view local_298;
  FieldGeneratorInfo *local_288;
  FieldGeneratorInfo *info_1;
  FieldDescriptor *field_2;
  undefined1 auStack_270 [4];
  int i_1;
  string_view local_260;
  string_view local_250;
  string_view local_240;
  string_view local_230;
  string_view local_220;
  string_view local_210;
  string_view local_200;
  string_view local_1f0;
  string_view local_1e0;
  string_view local_1d0;
  string_view local_1c0;
  string_view local_1b0;
  AlphaNum local_1a0;
  string local_170;
  string_view local_150;
  FieldDescriptor *local_140;
  FieldDescriptor *field_1;
  undefined1 auStack_130 [4];
  int j;
  string_view local_120;
  OneofDescriptor *local_110;
  OneofDescriptor *oneof;
  pair<const_int,_const_google::protobuf::OneofDescriptor_*> *kv;
  int local_f8;
  undefined1 local_f0 [8];
  iterator __end3;
  undefined1 local_d0 [8];
  iterator __begin3;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *__range3;
  string_view local_a8;
  FieldGeneratorInfo *local_98;
  FieldGeneratorInfo *info;
  FieldDescriptor *field;
  int i;
  string local_78;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"@java.lang.Override\npublic boolean equals(");
  protobuf::io::Printer::Print<>(printer,local_28);
  pOVar5 = Context::options(this->context_);
  pPVar1 = local_18;
  if ((pOVar5->opensource_runtime & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"@com.google.protobuf.Internal.ProtoMethodAcceptsNullParameter\n");
    protobuf::io::Printer::Print<>(pPVar1,local_38);
  }
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"final java.lang.Object obj) {\n");
  protobuf::io::Printer::Print<>(pPVar1,local_48);
  protobuf::io::Printer::Indent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,
             "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
            );
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_78,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  protobuf::io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar1,local_58,(char (*) [10])0x1fb9081,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  for (field._0_4_ = 0; iVar4 = (int)field,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar4 < iVar3;
      field._0_4_ = (int)field + 1) {
    info = (FieldGeneratorInfo *)
           Descriptor::field((this->super_MessageGenerator).descriptor_,(int)field);
    bVar2 = IsRealOneof((FieldDescriptor *)info);
    if (!bVar2) {
      local_98 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info);
      bVar2 = FieldDescriptor::has_presence((FieldDescriptor *)info);
      pPVar1 = local_18;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a8,
                   "if (has$name$() != other.has$name$()) return false;\nif (has$name$()) {\n");
        protobuf::io::Printer::Print<char[5],std::__cxx11::string>
                  (pPVar1,local_a8,(char (*) [5])0x1d1c66d,&local_98->capitalized_name);
        protobuf::io::Printer::Indent(local_18);
      }
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,(FieldDescriptor *)info);
      (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0x12])(pIVar6,local_18);
      bVar2 = FieldDescriptor::has_presence((FieldDescriptor *)info);
      if (bVar2) {
        protobuf::io::Printer::Outdent(local_18);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"}\n");
        protobuf::io::Printer::Print<>(pPVar1,___range3);
      }
    }
  }
  __begin3._8_8_ = &(this->super_MessageGenerator).oneofs_;
  iVar8 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
          ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                   *)__begin3._8_8_);
  __end3._8_8_ = iVar8.node_;
  __begin3.node_._0_4_ = iVar8.position_;
  local_d0 = (undefined1  [8])__end3._8_8_;
  iVar8 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                 *)__begin3._8_8_);
  kv = (pair<const_int,_const_google::protobuf::OneofDescriptor_*> *)iVar8.node_;
  local_f8 = iVar8.position_;
  local_f0 = (undefined1  [8])kv;
  __end3.node_._0_4_ = local_f8;
  while (bVar2 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                               *)local_d0,(iterator *)local_f0), pPVar1 = local_18, bVar2) {
    oneof = (OneofDescriptor *)
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                         *)local_d0);
    pPVar1 = local_18;
    local_110 = (OneofDescriptor *)(oneof->all_names_).payload_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_120,
               "if (!get$oneof_capitalized_name$Case().equals(other.get$oneof_capitalized_name$Case())) return false;\n"
              );
    pOVar7 = Context::GetOneofGeneratorInfo(this->context_,local_110);
    protobuf::io::Printer::Print<char[23],std::__cxx11::string>
              (pPVar1,local_120,(char (*) [23])"oneof_capitalized_name",&pOVar7->capitalized_name);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_130,
               "switch ($oneof_name$Case_) {\n");
    pOVar7 = Context::GetOneofGeneratorInfo(this->context_,local_110);
    protobuf::io::Printer::Print<char[11],std::__cxx11::string>
              (pPVar1,_auStack_130,(char (*) [11])0x1f94809,&pOVar7->name);
    protobuf::io::Printer::Indent(local_18);
    for (field_1._4_4_ = 0; iVar4 = field_1._4_4_, iVar3 = OneofDescriptor::field_count(local_110),
        pPVar1 = local_18, iVar4 < iVar3; field_1._4_4_ = field_1._4_4_ + 1) {
      local_140 = OneofDescriptor::field(local_110,field_1._4_4_);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_150,"case $field_number$:\n");
      iVar4 = FieldDescriptor::number(local_140);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1a0,iVar4);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_170,(lts_20250127 *)&local_1a0,a);
      protobuf::io::Printer::Print<char[13],std::__cxx11::string>
                (pPVar1,local_150,(char (*) [13])0x1f881b7,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      protobuf::io::Printer::Indent(local_18);
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,local_140);
      (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0x12])(pIVar6,local_18);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1b0,"break;\n");
      protobuf::io::Printer::Print<>(pPVar1,local_1b0);
      protobuf::io::Printer::Outdent(local_18);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1c0,"case 0:\ndefault:\n");
    protobuf::io::Printer::Print<>(pPVar1,local_1c0);
    protobuf::io::Printer::Outdent(local_18);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d0,"}\n");
    protobuf::io::Printer::Print<>(pPVar1,local_1d0);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  *)local_d0);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1e0,"if (!getUnknownFields().equals(other.getUnknownFields())) return false;\n")
  ;
  protobuf::io::Printer::Print<>(pPVar1,local_1e0);
  iVar4 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  pPVar1 = local_18;
  if (0 < iVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f0,
               "if (!getExtensionFields().equals(other.getExtensionFields()))\n  return false;\n");
    protobuf::io::Printer::Print<>(pPVar1,local_1f0);
  }
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_200,"return true;\n");
  protobuf::io::Printer::Print<>(pPVar1,local_200);
  protobuf::io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_210,"}\n\n");
  protobuf::io::Printer::Print<>(pPVar1,local_210);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_220,"@java.lang.Override\npublic int hashCode() {\n");
  protobuf::io::Printer::Print<>(pPVar1,local_220);
  protobuf::io::Printer::Indent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_230,"if (memoizedHashCode != 0) {\n");
  protobuf::io::Printer::Print<>(pPVar1,local_230);
  protobuf::io::Printer::Indent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_240,"return memoizedHashCode;\n");
  protobuf::io::Printer::Print<>(pPVar1,local_240);
  protobuf::io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_250,"}\nint hash = 41;\n");
  protobuf::io::Printer::Print<>(pPVar1,local_250);
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar2 = MessageOptions::no_standard_descriptor_accessor(this_00);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_260,"hash = (19 * hash) + getDescriptorForType().hashCode();\n");
    protobuf::io::Printer::Print<>(pPVar1,local_260);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_270,
               "hash = (19 * hash) + getDescriptor().hashCode();\n");
    protobuf::io::Printer::Print<>(pPVar1,_auStack_270);
  }
  for (field_2._4_4_ = 0; iVar4 = field_2._4_4_,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar4 < iVar3;
      field_2._4_4_ = field_2._4_4_ + 1) {
    info_1 = (FieldGeneratorInfo *)
             Descriptor::field((this->super_MessageGenerator).descriptor_,field_2._4_4_);
    bVar2 = IsRealOneof((FieldDescriptor *)info_1);
    if (!bVar2) {
      local_288 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info_1);
      bVar2 = FieldDescriptor::has_presence((FieldDescriptor *)info_1);
      pPVar1 = local_18;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_298,"if (has$name$()) {\n");
        protobuf::io::Printer::Print<char[5],std::__cxx11::string>
                  (pPVar1,local_298,(char (*) [5])0x1d1c66d,&local_288->capitalized_name);
        protobuf::io::Printer::Indent(local_18);
      }
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,(FieldDescriptor *)info_1);
      (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0x13])(pIVar6,local_18);
      bVar2 = FieldDescriptor::has_presence((FieldDescriptor *)info_1);
      if (bVar2) {
        protobuf::io::Printer::Outdent(local_18);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&__range3_1,"}\n");
        protobuf::io::Printer::Print<>(pPVar1,___range3_1);
      }
    }
  }
  __begin3_1._8_8_ = &(this->super_MessageGenerator).oneofs_;
  iVar8 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
          ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                   *)__begin3_1._8_8_);
  __end3_1._8_8_ = iVar8.node_;
  __begin3_1.node_._0_4_ = iVar8.position_;
  local_2c0 = (undefined1  [8])__end3_1._8_8_;
  iVar8 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                 *)__begin3_1._8_8_);
  kv_1 = (pair<const_int,_const_google::protobuf::OneofDescriptor_*> *)iVar8.node_;
  local_2e8 = iVar8.position_;
  local_2e0 = (undefined1  [8])kv_1;
  __end3_1.node_._0_4_ = local_2e8;
  while (bVar2 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                               *)local_2c0,(iterator *)local_2e0), bVar2) {
    oneof_1 = (OneofDescriptor *)
              absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                           *)local_2c0);
    pPVar1 = local_18;
    local_300 = (OneofDescriptor *)(oneof_1->all_names_).payload_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_310,
               "switch ($oneof_name$Case_) {\n");
    pOVar7 = Context::GetOneofGeneratorInfo(this->context_,local_300);
    protobuf::io::Printer::Print<char[11],std::__cxx11::string>
              (pPVar1,_auStack_310,(char (*) [11])0x1f94809,&pOVar7->name);
    protobuf::io::Printer::Indent(local_18);
    for (field_3._4_4_ = 0; iVar4 = field_3._4_4_, iVar3 = OneofDescriptor::field_count(local_300),
        pPVar1 = local_18, iVar4 < iVar3; field_3._4_4_ = field_3._4_4_ + 1) {
      local_320 = OneofDescriptor::field(local_300,field_3._4_4_);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_330,"case $field_number$:\n");
      iVar4 = FieldDescriptor::number(local_320);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_380,iVar4);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_350,(lts_20250127 *)&local_380,a_00);
      protobuf::io::Printer::Print<char[13],std::__cxx11::string>
                (pPVar1,local_330,(char (*) [13])0x1f881b7,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      protobuf::io::Printer::Indent(local_18);
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,local_320);
      (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0x13])(pIVar6,local_18);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_390,"break;\n");
      protobuf::io::Printer::Print<>(pPVar1,local_390);
      protobuf::io::Printer::Outdent(local_18);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3a0,"case 0:\ndefault:\n");
    protobuf::io::Printer::Print<>(pPVar1,local_3a0);
    protobuf::io::Printer::Outdent(local_18);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b0,"}\n");
    protobuf::io::Printer::Print<>(pPVar1,local_3b0);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  *)local_2c0);
  }
  iVar4 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  pPVar1 = local_18;
  if (0 < iVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3c0,"hash = hashFields(hash, getExtensionFields());\n");
    protobuf::io::Printer::Print<>(pPVar1,local_3c0);
  }
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3d0,"hash = (29 * hash) + getUnknownFields().hashCode();\n");
  protobuf::io::Printer::Print<>(pPVar1,local_3d0);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3e0,"memoizedHashCode = hash;\nreturn hash;\n");
  protobuf::io::Printer::Print<>(pPVar1,local_3e0);
  protobuf::io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f0,"}\n\n");
  protobuf::io::Printer::Print<>(pPVar1,local_3f0);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateEqualsAndHashCode(
    io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public boolean equals(");
  if (!context_->options().opensource_runtime) {
    printer->Print(
        "@com.google.protobuf.Internal.ProtoMethodAcceptsNullParameter\n");
  }
  printer->Print("final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
      "if (obj == this) {\n"
      " return true;\n"
      "}\n"
      "if (!(obj instanceof $classname$)) {\n"
      // don't simply return false because mutable and immutable types
      // can be equal
      "  return super.equals(obj);\n"
      "}\n"
      "$classname$ other = ($classname$) obj;\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      if (field->has_presence()) {
        printer->Print(
            "if (has$name$() != other.has$name$()) return false;\n"
            "if (has$name$()) {\n",
            "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (field->has_presence()) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Compare oneofs.
  for (const auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    printer->Print(
        "if (!get$oneof_capitalized_name$Case().equals("
        "other.get$oneof_capitalized_name$Case())) return false;\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     absl::StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // Always consider unknown fields for equality. This will sometimes return
  // false for non-canonical ordering when running in LITE_RUNTIME but it's
  // the best we can do.
  printer->Print(
      "if (!getUnknownFields().equals(other.getUnknownFields())) return "
      "false;\n");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!getExtensionFields().equals(other.getExtensionFields()))\n"
        "  return false;\n");
  }
  printer->Print("return true;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public int hashCode() {\n");
  printer->Indent();
  printer->Print("if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print("return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      if (field->has_presence()) {
        printer->Print("if (has$name$()) {\n", "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (field->has_presence()) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (const auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     absl::StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print("hash = (29 * hash) + getUnknownFields().hashCode();\n");
  printer->Print(
      "memoizedHashCode = hash;\n"
      "return hash;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");
}